

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

ofstream * operator<<(ofstream *os,SSTableDataEntry *s)

{
  SSTableDataEntry *s_local;
  ofstream *os_local;
  
  bytes_write<bool>((ostream *)os,&s->delete_flag,0);
  bytes_write<long>((ostream *)os,&s->timestamp,0);
  bytes_write<long_long>((ostream *)os,&s->key,0);
  bytes_write<unsigned_long>((ostream *)os,&s->value_length,0);
  bytes_write<std::__cxx11::string>((ostream *)os,&s->value,0);
  return os;
}

Assistant:

std::ofstream &operator<<(std::ofstream &os, const SSTableDataEntry &s) {
    bytes_write(os, &s.delete_flag);
    bytes_write(os, &s.timestamp);
    bytes_write(os, &s.key);
    bytes_write(os, &s.value_length);
    bytes_write(os, &s.value);
    return os;
}